

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>_> * __thiscall
boost::shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>_>::
operator=(shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>_>
          *this,shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>_>
                *r)

{
  shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>_> *in_RDI;
  shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>_>
  *in_stack_ffffffffffffffe0;
  
  shared_ptr(in_stack_ffffffffffffffe0,in_RDI);
  swap(in_stack_ffffffffffffffe0,in_RDI);
  ~shared_ptr((shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>_>
               *)0x97b8ae);
  return in_RDI;
}

Assistant:

shared_ptr & operator=( shared_ptr const & r ) BOOST_NOEXCEPT
    {
        this_type(r).swap(*this);
        return *this;
    }